

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

BackwardMatch * __thiscall
brotli::HashToBinaryTree::StoreAndFindMatches
          (HashToBinaryTree *this,uint8_t *data,size_t cur_ix,size_t ring_buffer_mask,
          size_t max_length,size_t *best_len,BackwardMatch *matches)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint32_t *puVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t depth_remaining;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong local_68;
  ulong local_60;
  
  uVar15 = ring_buffer_mask & cur_ix;
  uVar2 = this->window_mask_;
  uVar6 = (uint)(*(int *)(data + uVar15) * 0x1e35a7bd) >> 0xf;
  uVar8 = uVar2 & cur_ix;
  uVar19 = (ulong)this->buckets_[uVar6];
  uVar5 = max_length;
  if (0x7f < max_length) {
    this->buckets_[uVar6] = (uint32_t)cur_ix;
    uVar5 = 0x80;
  }
  lVar18 = uVar8 * 2 + 1;
  lVar10 = uVar8 * 2;
  lVar17 = 0x40;
  local_60 = 0;
  local_68 = 0;
  do {
    uVar8 = cur_ix - uVar19;
    if ((uVar8 == 0) || (lVar17 == 0 || uVar2 - 0xf < uVar8)) {
      if (0x7f < max_length) {
        puVar3 = this->forest_;
        puVar3[lVar10] = this->invalid_pos_;
        puVar3[lVar18] = this->invalid_pos_;
      }
LAB_0016dab8:
      bVar4 = false;
    }
    else {
      uVar9 = local_68;
      if (local_60 < local_68) {
        uVar9 = local_60;
      }
      puVar1 = data + uVar9 + (uVar19 & ring_buffer_mask);
      uVar14 = max_length - uVar9;
      if (7 < uVar14) {
        uVar11 = uVar14 & 0xfffffffffffffff8;
        puVar7 = puVar1 + uVar11;
        lVar12 = 0;
        uVar16 = 0;
LAB_0016db32:
        if (*(ulong *)(puVar1 + uVar16 * 8) == *(ulong *)(data + uVar16 * 8 + uVar9 + uVar15))
        break;
        uVar11 = *(ulong *)(data + uVar16 * 8 + uVar9 + uVar15) ^ *(ulong *)(puVar1 + uVar16 * 8);
        uVar14 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar16 = (uVar14 >> 3 & 0x1fffffff) - lVar12;
        goto LAB_0016dba0;
      }
      uVar11 = 0;
      puVar7 = puVar1;
LAB_0016dc93:
      uVar14 = uVar14 & 7;
      uVar16 = uVar11;
      if (uVar14 != 0) {
        uVar13 = uVar11 | uVar14;
        do {
          uVar16 = uVar11;
          if (data[uVar11 + uVar9 + uVar15] != *puVar7) break;
          puVar7 = puVar7 + 1;
          uVar11 = uVar11 + 1;
          uVar14 = uVar14 - 1;
          uVar16 = uVar13;
        } while (uVar14 != 0);
      }
LAB_0016dba0:
      uVar16 = uVar16 + uVar9;
      if (*best_len < uVar16) {
        *best_len = uVar16;
        if (matches == (BackwardMatch *)0x0) {
          matches = (BackwardMatch *)0x0;
        }
        else {
          *matches = (BackwardMatch)(uVar8 & 0xffffffff | uVar16 << 0x25);
          matches = matches + 1;
        }
        if (uVar5 <= uVar16) {
          if (0x7f < max_length) {
            puVar3 = this->forest_;
            uVar8 = this->window_mask_ & uVar19;
            puVar3[lVar10] = puVar3[uVar8 * 2];
            puVar3[lVar18] = puVar3[uVar8 * 2 + 1];
            goto LAB_0016dab8;
          }
          bVar4 = false;
          goto LAB_0016daba;
        }
      }
      if (data[uVar16 + (uVar19 & ring_buffer_mask)] < data[uVar16 + uVar15]) {
        if (0x7f < max_length) {
          this->forest_[lVar10] = (uint32_t)uVar19;
        }
        lVar10 = (uVar19 & this->window_mask_) * 2 + 1;
        lVar12 = lVar10;
        local_68 = uVar16;
      }
      else {
        if (0x7f < max_length) {
          this->forest_[lVar18] = (uint32_t)uVar19;
        }
        lVar18 = (uVar19 & this->window_mask_) * 2;
        lVar12 = lVar18;
        local_60 = uVar16;
      }
      uVar19 = (ulong)this->forest_[lVar12];
      bVar4 = true;
    }
LAB_0016daba:
    lVar17 = lVar17 + -1;
    if (!bVar4) {
      return matches;
    }
  } while( true );
  uVar16 = uVar16 + 1;
  lVar12 = lVar12 + -8;
  if (uVar14 >> 3 == uVar16) goto LAB_0016dc93;
  goto LAB_0016db32;
}

Assistant:

BackwardMatch* StoreAndFindMatches(const uint8_t* const __restrict data,
                                     const size_t cur_ix,
                                     const size_t ring_buffer_mask,
                                     const size_t max_length,
                                     size_t* const __restrict best_len,
                                     BackwardMatch* __restrict matches) {
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const size_t max_backward = window_mask_ - 15;
    const size_t max_comp_len = std::min(max_length, kMaxTreeCompLength);
    const bool reroot_tree = max_length >= kMaxTreeCompLength;
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    size_t prev_ix = buckets_[key];
    // The forest index of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_left = LeftChildIndex(cur_ix);
    // The forest index of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_right = RightChildIndex(cur_ix);
    // The match length of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_left = 0;
    // The match length of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_right = 0;
    if (reroot_tree) {
      buckets_[key] = static_cast<uint32_t>(cur_ix);
    }
    for (size_t depth_remaining = kMaxTreeSearchDepth; ; --depth_remaining) {
      const size_t backward = cur_ix - prev_ix;
      const size_t prev_ix_masked = prev_ix & ring_buffer_mask;
      if (backward == 0 || backward > max_backward || depth_remaining == 0) {
        if (reroot_tree) {
          forest_[node_left] = invalid_pos_;
          forest_[node_right] = invalid_pos_;
        }
        break;
      }
      const size_t cur_len = std::min(best_len_left, best_len_right);
      const size_t len = cur_len +
          FindMatchLengthWithLimit(&data[cur_ix_masked + cur_len],
                                   &data[prev_ix_masked + cur_len],
                                   max_length - cur_len);
      if (len > *best_len) {
        *best_len = len;
        if (matches) {
          *matches++ = BackwardMatch(backward, len);
        }
        if (len >= max_comp_len) {
          if (reroot_tree) {
            forest_[node_left] = forest_[LeftChildIndex(prev_ix)];
            forest_[node_right] = forest_[RightChildIndex(prev_ix)];
          }
          break;
        }
      }
      if (data[cur_ix_masked + len] > data[prev_ix_masked + len]) {
        best_len_left = len;
        if (reroot_tree) {
          forest_[node_left] = static_cast<uint32_t>(prev_ix);
        }
        node_left = RightChildIndex(prev_ix);
        prev_ix = forest_[node_left];
      } else {
        best_len_right = len;
        if (reroot_tree) {
          forest_[node_right] = static_cast<uint32_t>(prev_ix);
        }
        node_right = LeftChildIndex(prev_ix);
        prev_ix = forest_[node_right];
      }
    }
    return matches;
  }